

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void __thiscall CVmObjTable::gc_trace_imports(CVmObjTable *this)

{
  undefined8 in_RDI;
  CVmObjTable *unaff_retaddr;
  
  if (G_predef_X.rterr != 0) {
    add_to_gc_queue(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (G_predef_X.stack_info_cls != 0) {
    add_to_gc_queue(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (G_predef_X.const_str_obj != 0) {
    add_to_gc_queue(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (G_predef_X.const_lst_obj != 0) {
    add_to_gc_queue(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (G_predef_X.last_prop_obj != 0) {
    add_to_gc_queue(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (G_predef_X.storage_server_error != 0) {
    add_to_gc_queue(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (G_predef_X.gramprod_gram_alt_info != 0) {
    add_to_gc_queue(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (G_predef_X.gramprod_gram_alt_tok_info != 0) {
    add_to_gc_queue(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (G_predef_X.charset_unknown_exc != 0) {
    add_to_gc_queue(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (G_predef_X.file_not_found_exc != 0) {
    add_to_gc_queue(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (G_predef_X.file_creation_exc != 0) {
    add_to_gc_queue(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (G_predef_X.file_open_exc != 0) {
    add_to_gc_queue(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (G_predef_X.file_io_exc != 0) {
    add_to_gc_queue(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (G_predef_X.file_sync_exc != 0) {
    add_to_gc_queue(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (G_predef_X.file_closed_exc != 0) {
    add_to_gc_queue(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (G_predef_X.file_mode_exc != 0) {
    add_to_gc_queue(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (G_predef_X.file_safety_exc != 0) {
    add_to_gc_queue(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (G_predef_X.file_info != 0) {
    add_to_gc_queue(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (G_predef_X.compiler_exc != 0) {
    add_to_gc_queue(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (G_predef_X.net_exception != 0) {
    add_to_gc_queue(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (G_predef_X.net_reset_exception != 0) {
    add_to_gc_queue(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (G_predef_X.net_safety_exception != 0) {
    add_to_gc_queue(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (G_predef_X.net_event != 0) {
    add_to_gc_queue(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (G_predef_X.net_request_event != 0) {
    add_to_gc_queue(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (G_predef_X.net_timeout_event != 0) {
    add_to_gc_queue(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (G_predef_X.net_reply_event != 0) {
    add_to_gc_queue(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (G_predef_X.net_reply_done_event != 0) {
    add_to_gc_queue(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (G_predef_X.file_upload_cl != 0) {
    add_to_gc_queue(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  if (G_predef_X.reflection_services != 0) {
    add_to_gc_queue(unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  return;
}

Assistant:

void CVmObjTable::gc_trace_imports(VMG0_)
{
    /*
     *   generate the list of object imports; for each one, if we have a
     *   valid object for the import, mark it as reachable 
     */
#define VM_IMPORT_OBJ(sym, mem) \
    if (G_predef->mem != VM_INVALID_OBJ) \
        add_to_gc_queue(G_predef->mem, VMOBJ_REACHABLE);
#define VM_NOIMPORT_OBJ(sym, mem) VM_IMPORT_OBJ(sym, mem)
#include "vmimport.h"
}